

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

SIMDLoad * __thiscall
wasm::Builder::makeSIMDLoad
          (Builder *this,SIMDLoadOp op,Address offset,Address align,Expression *ptr,Name memory)

{
  SIMDLoad *this_00;
  
  this_00 = MixedArena::alloc<wasm::SIMDLoad>(&this->wasm->allocator);
  this_00->op = op;
  (this_00->offset).addr = offset.addr;
  (this_00->align).addr = align.addr;
  this_00->ptr = ptr;
  (this_00->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (this_00->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  SIMDLoad::finalize(this_00);
  return this_00;
}

Assistant:

SIMDLoad* makeSIMDLoad(SIMDLoadOp op,
                         Address offset,
                         Address align,
                         Expression* ptr,
                         Name memory) {
    auto* ret = wasm.allocator.alloc<SIMDLoad>();
    ret->op = op;
    ret->offset = offset;
    ret->align = align;
    ret->ptr = ptr;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }